

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall kj::Promise<bool>::wait(Promise<bool> *this,void *__stat_loc)

{
  bool bVar1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *node;
  ExceptionOr<bool> *result_00;
  undefined8 extraout_RAX;
  undefined1 in_stack_00000008 [24];
  undefined1 local_1b8 [8];
  ExceptionOr<bool> result;
  WaitScope *waitScope_local;
  Promise<bool> *this_local;
  
  result._408_8_ = __stat_loc;
  kj::_::ExceptionOr<bool>::ExceptionOr((ExceptionOr<bool> *)local_1b8);
  node = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this);
  kj::_::waitImpl(node,(ExceptionOrValue *)local_1b8,(WaitScope *)result._408_8_,
                  (SourceLocation)in_stack_00000008);
  result_00 = mv<kj::_::ExceptionOr<bool>>((ExceptionOr<bool> *)local_1b8);
  bVar1 = kj::_::convertToReturn<bool>(result_00);
  kj::_::ExceptionOr<bool>::~ExceptionOr((ExceptionOr<bool> *)local_1b8);
  return (__pid_t)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1);
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}